

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTCTEDataPassThrough::deinit(TessellationShaderTCTEDataPassThrough *this)

{
  pointer p_Var1;
  TessellationShaderUtils *this_00;
  int iVar2;
  undefined4 extraout_var;
  pointer p_Var4;
  pointer this_01;
  long lVar3;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar3 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    (**(code **)(lVar3 + 0x4e8))(0x8c89);
    (**(code **)(lVar3 + 0x40))(0x8c8e,0);
    (**(code **)(lVar3 + 0x48))(0x8c8e,0,0);
    (**(code **)(lVar3 + 0xd8))(0);
    if (this->m_bo_id != 0) {
      (**(code **)(lVar3 + 0x438))(1,&this->m_bo_id);
      this->m_bo_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
    for (p_Var4 = (this->m_runs).
                  super__Vector_base<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_Var1 = (this->m_runs).
                 super__Vector_base<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>
                 ._M_impl.super__Vector_impl_data._M_finish, p_Var4 != p_Var1; p_Var4 = p_Var4 + 1)
    {
      deinitTestRun(this,p_Var4);
    }
    p_Var4 = (this->m_runs).
             super__Vector_base<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_01 = p_Var4;
    if (p_Var1 != p_Var4) {
      do {
        _run::~_run(this_01);
        this_01 = this_01 + 1;
      } while (this_01 != p_Var1);
      (this->m_runs).
      super__Vector_base<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>
      ._M_impl.super__Vector_impl_data._M_finish = p_Var4;
    }
    this_00 = this->m_utils_ptr;
    if (this_00 != (TessellationShaderUtils *)0x0) {
      TessellationShaderUtils::~TessellationShaderUtils(this_00);
      operator_delete(this_00,0x20);
      this->m_utils_ptr = (TessellationShaderUtils *)0x0;
    }
  }
  return;
}

Assistant:

void TessellationShaderTCTEDataPassThrough::deinit()
{
	/** Call base class' deinit() function */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Revert GL_PATCH_VERTICES_EXT value to the default setting */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	/* Disable GL_RASTERIZER_DISCARD mode */
	gl.disable(GL_RASTERIZER_DISCARD);

	/* Revert TF buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 0 /* buffer */);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Release all objects we might've created */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	for (_runs::iterator it = m_runs.begin(); it != m_runs.end(); ++it)
	{
		deinitTestRun(*it);
	}
	m_runs.clear();

	/* Release Utils instance */
	if (m_utils_ptr != DE_NULL)
	{
		delete m_utils_ptr;

		m_utils_ptr = DE_NULL;
	}
}